

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion_data.h
# Opt level: O2

bool ximu::operator==(Quaternion<float> *lhs,Quaternion<float> *rhs)

{
  bool bVar1;
  
  if ((((lhs->_w != rhs->_w) || (NAN(lhs->_w) || NAN(rhs->_w))) || (lhs->_x != rhs->_x)) ||
     (((NAN(lhs->_x) || NAN(rhs->_x) || (lhs->_y != rhs->_y)) || (NAN(lhs->_y) || NAN(rhs->_y))))) {
    bVar1 = false;
  }
  else {
    bVar1 = (bool)(-(rhs->_z == lhs->_z) & 1);
  }
  return bVar1;
}

Assistant:

bool operator==(const Quaternion<T>& lhs, const Quaternion<T> & rhs) {
    return lhs.w() == rhs.w() && lhs.x() == rhs.x() &&
        lhs.y()== rhs.y() && lhs.z() == rhs.z();
  }